

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O2

void robot_speed(SpurUserParamsPtr spur)

{
  ParametersPtr p_Var1;
  long lVar2;
  motor_id motor;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar3 = 0;
  p_Var1 = get_param_ptr();
  lVar2 = -0x10;
  do {
    if (lVar2 == 0) {
      return;
    }
    if (p_Var1->motor_enable[lVar2 + 0x10] != 0) {
      motor = (int)lVar2 + 0x10;
      dVar4 = p(YP_PARAM_VEHICLE_CONTROL,motor);
      if (0.0 < dVar4) {
        spur->wheel_angle[lVar2] = 0.0;
        spur->wheel_mode_prev[lVar2] = MOTOR_CONTROL_VEHICLE;
        if (iVar3 == 1) {
          dVar4 = spur->wref_smooth;
          dVar5 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
          dVar4 = -(dVar5 * dVar4 * 0.5 - spur->vref_smooth);
LAB_00108bfa:
          dVar5 = p(YP_PARAM_RADIUS,motor);
          spur->wheel_angle[lVar2] = dVar4 / dVar5;
        }
        else if (iVar3 == 0) {
          dVar4 = spur->wref_smooth;
          dVar5 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
          dVar4 = dVar5 * dVar4 * 0.5 + spur->vref_smooth;
          goto LAB_00108bfa;
        }
        iVar3 = iVar3 + 1;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void robot_speed(SpurUserParamsPtr spur)
{
  int i;
  int vc_i;

  ParametersPtr param;
  param = get_param_ptr();

  vc_i = 0;
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!param->motor_enable[i])
      continue;

    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
    {
      spur->wheel_vel_smooth[i] = 0;
      spur->wheel_mode[i] = MOTOR_CONTROL_VEHICLE;

      switch (vc_i)
      {
        case 0:
          spur->wheel_vel_smooth[i] = (0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) + spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        case 1:
          spur->wheel_vel_smooth[i] = -(0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) - spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        default:
          break;
      }
      vc_i++;
    }
  }
}